

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_opengl.h
# Opt level: O1

bool djgt_push_image_hdr(djg_texture *texture,char *filename,bool flipy)

{
  djg_texture *texture_00;
  float *pfVar1;
  
  texture_00 = djgt_create(texture->comp);
  texture_00->pf = 4;
  pfVar1 = stbi_loadf(filename,&texture_00->x,&texture_00->y,&texture_00->comp,texture->comp);
  texture_00->texels = (char *)pfVar1;
  if (pfVar1 == (float *)0x0) {
    fwrite("djg_error: Image loading failed\n",0x20,1,_stdout);
    fflush(_stdout);
    fwrite("-- Begin -- STBI Log\n",0x15,1,_stdout);
    fflush(_stdout);
    fprintf(_stdout,"%s\n",stbi__g_failure_reason);
    fflush(_stdout);
    fwrite("-- End -- STBI Log\n",0x13,1,_stdout);
    fflush(_stdout);
    djgt_release(texture_00);
  }
  else {
    djgt__push_texture(texture,texture_00,flipy);
  }
  return pfVar1 != (float *)0x0;
}

Assistant:

DJGDEF bool
djgt_push_image_hdr(djg_texture *texture, const char *filename, bool flipy)
{
    djg_texture *tail = djgt_create(texture->comp);

    tail->pf = DJGT_PF_F32;
    tail->texels = (char *)stbi_loadf(
        filename, &tail->x, &tail->y, &tail->comp, texture->comp
    );
    if (!tail->texels) {
        DJG_LOG("djg_error: Image loading failed\n");
#ifndef STBI_NO_FAILURE_STRINGS
        DJG_LOG("-- Begin -- STBI Log\n");
        DJG_LOG("%s\n", stbi_failure_reason());
        DJG_LOG("-- End -- STBI Log\n");
#endif // STBI_NO_FAILURE_STRINGS
        djgt_release(tail);

        return false;
    }
    djgt__push_texture(texture, tail, flipy);

    return true;
}